

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

int lj_tab_isempty(GCtab *t)

{
  Node *n;
  MSize i;
  Node *node;
  cTValue *e;
  MSize narr;
  GCtab *t_local;
  
  for (n._4_4_ = 0; n._4_4_ < t->asize; n._4_4_ = n._4_4_ + 1) {
    if (*(long *)((t->array).ptr64 + (ulong)n._4_4_ * 8) != -1) {
      return 0;
    }
  }
  if (t->hmask != 0) {
    for (n._4_4_ = 0; n._4_4_ <= t->hmask; n._4_4_ = n._4_4_ + 1) {
      if (*(long *)((t->node).ptr64 + (ulong)n._4_4_ * 0x18) != -1) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int LJ_FASTCALL lj_tab_isempty(const GCtab *t)
{
  MSize narr = (MSize)t->asize;
  cTValue *e;
  Node *node;
  MSize i;

  e = tvref(t->array);
  for (i = 0; i < narr; i++)
    if (LJ_LIKELY(!tvisnil(&e[i])))
      return 0;

  if (t->hmask <= 0)
    return 1;

  node = noderef(t->node);
  for (i = 0; i <= (MSize)t->hmask; i++) {
    Node *n = &node[i];
    if (LJ_LIKELY(!tvisnil(&n->val))) {
      return 0;
    }
  }

  return 1;
}